

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

string * __thiscall
supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::
getNewBlockName_abi_cxx11_
          (string *__return_storage_ptr__,
          Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long> *this)

{
  size_type *psVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char cVar7;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(this + 0x88),
             *(long *)(this + 0x90) + *(long *)(this + 0x88));
  std::__cxx11::string::append((char *)&local_48);
  uVar4 = (**(code **)(*(long *)(*(long *)(this + 0x18) + 8) + 8))(*(long *)(this + 0x18) + 8);
  cVar7 = '\x01';
  if (9 < uVar4) {
    uVar6 = uVar4;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001a0260;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001a0260;
      }
      if (uVar6 < 10000) goto LAB_001a0260;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar2);
    cVar7 = cVar7 + '\x01';
  }
LAB_001a0260:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_88,local_80,uVar4);
  uVar4 = CONCAT44(uStack_7c,local_80) + local_40;
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < uVar4) {
    uVar6 = 0xf;
    if (local_88 != local_78) {
      uVar6 = local_78[0];
    }
    if (uVar4 <= uVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_48);
      goto LAB_001a02dd;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_88);
LAB_001a02dd:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_68.field_2._M_allocated_capacity = *psVar1;
    local_68.field_2._8_8_ = puVar5[3];
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar1;
    local_68._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_68._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::addRandomString
            (__return_storage_ptr__,
             (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)this,
             &local_68,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string getNewBlockName() const {
        return addRandomString(indexFilesPrefix + "block-" + std::to_string(diskIndex_->getItemsCount()));
    }